

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.c
# Opt level: O2

void filter_run(filter *f,float in,float *out)

{
  int iVar1;
  int size;
  int iVar2;
  long lVar3;
  float fVar4;
  
  iVar1 = f->pointer;
  iVar2 = iVar1 + 1;
  f->pointer = iVar2;
  f->buffer[iVar1] = in;
  size = f->length;
  lVar3 = (long)size;
  fVar4 = filter_mac(f->buffer + iVar1 + -lVar3,f->taps,size);
  *out = fVar4;
  if (iVar2 == 0x400) {
    memcpy(f->buffer,&f->pointer + -lVar3,lVar3 * 4);
    f->pointer = size;
  }
  return;
}

Assistant:

void filter_run(struct filter *f, float in, float *out)
{
	float *ptr = f->buffer + f->pointer++;

	*ptr = in;
	
	// TODO: optimize: pass filter length as constant to enable
	// using optimized __mac_c and fix the number of rounds there!
	#ifndef	__HAVE_ARCH_MAC
	*out = filter_mac(ptr - f->length, f->taps, f->length);
	#else
	*out = mac(ptr - f->length, f->taps, f->length);
	#endif
	//*out = filter_mac(ptr - f->length, f->taps, 53);

	if (f->pointer == BufferLen) {
		memcpy(f->buffer, 
		       f->buffer + BufferLen - f->length,
		       f->length * sizeof(float));
		f->pointer = f->length;
	}
}